

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeLogger.h
# Opt level: O2

void __thiscall
TimeLogger<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~TimeLogger
          (TimeLogger<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this)

{
  ostream *poVar1;
  string asStack_38 [32];
  
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<(this->stream,"Date: ");
  get_date_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,asStack_38);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Elapsed time: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

~TimeLogger() {

        auto end = std::chrono::system_clock::now();
        stream << "Date: " << get_date() << std::endl
               << "Elapsed time: " << ch::duration_cast<T>(end - start).count() << std::endl;
    }